

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt.cc
# Opt level: O0

bool __thiscall re2c::Opt::output(Opt *this,char *s)

{
  bool bVar1;
  char *s_local;
  Opt *this_local;
  
  bVar1 = this->output_file == (char *)0x0;
  if (bVar1) {
    this->output_file = s;
  }
  else {
    error("multiple output files: %s, %s",this->output_file,s);
  }
  return bVar1;
}

Assistant:

bool Opt::output (const char * s)
{
	if (output_file)
	{
		error ("multiple output files: %s, %s", output_file, s);
		return false;
	}
	else
	{
		output_file = s;
		return true;
	}
}